

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O3

void opj_destroy_decompress(opj_dinfo_t *dinfo)

{
  if (dinfo != (opj_dinfo_t *)0x0) {
    if ((uint)dinfo->codec_format < 2) {
      j2k_destroy_decompress((opj_j2k_t *)dinfo->j2k_handle);
    }
    else if (dinfo->codec_format == CODEC_JP2) {
      jp2_destroy_decompress((opj_jp2_t *)dinfo->jp2_handle);
    }
    free(dinfo);
    return;
  }
  return;
}

Assistant:

void OPJ_CALLCONV opj_destroy_decompress(opj_dinfo_t *dinfo) {
	if(dinfo) {
		/* destroy the codec */
		switch(dinfo->codec_format) {
			case CODEC_J2K:
			case CODEC_JPT:
				j2k_destroy_decompress((opj_j2k_t*)dinfo->j2k_handle);
				break;
			case CODEC_JP2:
				jp2_destroy_decompress((opj_jp2_t*)dinfo->jp2_handle);
				break;
			case CODEC_UNKNOWN:
			default:
				break;
		}
		/* destroy the decompressor */
		opj_free(dinfo);
	}
}